

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

CheckerInstantiationSyntax * __thiscall
slang::parsing::Parser::parseCheckerInstantiation(Parser *this,AttrList attributes)

{
  bool bVar1;
  int iVar2;
  SourceLocation location;
  HierarchicalInstanceSyntax *pHVar3;
  undefined4 extraout_var;
  CheckerInstantiationSyntax *pCVar4;
  Info *extraout_RDX;
  Info *src;
  ulong uVar5;
  TokenKind kind;
  Token current;
  Token TVar6;
  Token TVar7;
  Token semi;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> items;
  Token local_1a8;
  ParameterValueAssignmentSyntax *local_198;
  NameSyntax *local_190;
  pointer local_188;
  size_t local_180;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_178;
  ulong local_168;
  undefined8 uStack_160;
  size_t local_158;
  pointer local_150;
  size_t local_148;
  Token local_140;
  SyntaxNode *local_130;
  SyntaxNode *pSStack_128;
  pointer local_118;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_108 [4];
  
  local_180 = (size_t)attributes._M_extent._M_extent_value;
  local_188 = attributes._M_ptr;
  local_190 = parseName(this,(bitmask<slang::parsing::detail::NameOptions>)0x40);
  local_198 = parseParameterValueAssignment(this);
  Token::Token(&local_1a8);
  local_108[0].data_ = (pointer)local_108[0].firstElement;
  local_108[0].len = 0;
  local_108[0].cap = 8;
  current = ParserBase::peek(&this->super_ParserBase);
  local_140 = current;
  bVar1 = syntax::SyntaxFacts::isSemicolon(current.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      location = Token::location(&local_140);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x400005,location);
    }
  }
  else {
    bVar1 = syntax::SyntaxFacts::isPossibleInstance(current.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,current,Semicolon,&local_1a8,(DiagCode)0x400005);
      src = extraout_RDX;
      goto LAB_001d93bc;
    }
    local_178._M_rest =
         (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseHierarchicalInstance(this);
    local_168 = CONCAT71(local_168._1_7_,1);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (local_108,(TokenOrSyntax *)&local_178._M_first);
    TVar6 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = syntax::SyntaxFacts::isSemicolon(TVar6.kind);
    if (TVar6.kind == Comma && !bVar1) {
      do {
        local_178._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_168 = local_168 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_108,(TokenOrSyntax *)&local_178._M_first);
        TVar6 = ParserBase::peek(&this->super_ParserBase);
        kind = TVar6.kind;
        bVar1 = syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if ((current.info == TVar6.info && current.kind == kind) &&
           (bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleInstance,&slang::syntax::SyntaxFacts::isSemicolon>
                              (&this->super_ParserBase,(DiagCode)0x400005,true), !bVar1)) break;
        pHVar3 = parseHierarchicalInstance(this);
        local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pHVar3;
        local_168 = CONCAT71(local_168._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_108,(TokenOrSyntax *)&local_178._M_first);
        TVar7 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = syntax::SyntaxFacts::isSemicolon(TVar7.kind);
        uVar5 = TVar6._0_8_ & 0xffffffff;
        current.info = TVar6.info;
        current.kind = (short)uVar5;
        current._2_1_ = (char)(uVar5 >> 0x10);
        current.numFlags.raw = (char)(uVar5 >> 0x18);
        current.rawLen = (int)(uVar5 >> 0x20);
      } while (TVar7.kind == Comma && !bVar1);
    }
  }
  local_1a8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  src = local_1a8.info;
LAB_001d93bc:
  local_178._8_4_ = 1;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = local_180;
  local_150 = local_188;
  local_148 = local_180;
  local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_002f75e8;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_108,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_118 = (pointer)CONCAT44(extraout_var,iVar2);
  local_140.info._0_4_ = 3;
  local_130 = (SyntaxNode *)0x0;
  pSStack_128 = (SyntaxNode *)0x0;
  local_140._0_8_ = &PTR_getChild_002f7b90;
  pCVar4 = syntax::SyntaxFactory::checkerInstantiation
                     (&this->factory,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_178._M_first,
                      local_190,local_198,
                      (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)&local_140,
                      local_1a8);
  if (local_108[0].data_ != (pointer)local_108[0].firstElement) {
    operator_delete(local_108[0].data_);
  }
  return pCVar4;
}

Assistant:

CheckerInstantiationSyntax& Parser::parseCheckerInstantiation(AttrList attributes) {
    auto& type = parseName(NameOptions::NoClassScope);
    auto parameters = parseParameterValueAssignment();

    Token semi;
    SmallVector<TokenOrSyntax, 8> items;
    parseList<isPossibleInstance, isSemicolon>(items, TokenKind::Semicolon, TokenKind::Comma, semi,
                                               RequireItems::True,
                                               diag::ExpectedHierarchicalInstantiation,
                                               [this] { return &parseHierarchicalInstance(); });

    return factory.checkerInstantiation(attributes, type, parameters, items.copy(alloc), semi);
}